

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint64_t helper_neon_qadd_u64_aarch64(CPUARMState_conflict *env,uint64_t src1,uint64_t src2)

{
  ulong local_28;
  uint64_t res;
  uint64_t src2_local;
  uint64_t src1_local;
  CPUARMState_conflict *env_local;
  
  local_28 = src1 + src2;
  if (local_28 < src1) {
    (env->vfp).qc[0] = 1;
    local_28 = 0xffffffffffffffff;
  }
  return local_28;
}

Assistant:

uint64_t HELPER(neon_qadd_u64)(CPUARMState *env, uint64_t src1, uint64_t src2)
{
    uint64_t res;

    res = src1 + src2;
    if (res < src1) {
        SET_QC();
        res = ~(uint64_t)0;
    }
    return res;
}